

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

void cplus::memory::testMemory_dark_magic(void)

{
  OutputStream *pOVar1;
  Test local_5b8;
  Test local_590;
  Test local_568;
  Test local_540;
  long local_518;
  size_t loopTime_11;
  char *swapB_11;
  char *swapA_11;
  Test local_4d8;
  Test local_4b0;
  Test local_488;
  Test local_460;
  Test local_438;
  long local_410;
  size_t loopTime_10;
  char *swapB_10;
  char *swapA_10;
  Test local_3d0;
  long local_3a8;
  size_t loopTime_9;
  char *swapB_9;
  char *swapA_9;
  size_t loopTime_8;
  char *swapB_8;
  char *swapA_8;
  size_t loopTime_7;
  char *swapB_7;
  char *swapA_7;
  size_t loopTime_6;
  char *swapB_6;
  char *swapA_6;
  Test local_320;
  Test local_2f8;
  Test local_2d0;
  long local_2a8;
  size_t loopTime_5;
  char *swapB_5;
  char *swapA_5;
  Test local_268;
  Test local_240;
  Test local_218;
  Test local_1f0;
  Test local_1c8;
  long local_1a0;
  size_t loopTime_4;
  char *swapB_4;
  char *swapA_4;
  Test local_160;
  long local_138;
  size_t loopTime_3;
  char *swapB_3;
  char *swapA_3;
  size_t loopTime_2;
  char *swapB_2;
  char *swapA_2;
  size_t loopTime_1;
  char *swapB_1;
  char *swapA_1;
  size_t loopTime;
  char *swapB;
  char *swapA;
  Test constTest2;
  Test constTest1;
  Test test2;
  Test test1;
  double constD2;
  double constD1;
  int constB;
  int constA;
  double d2;
  double d1;
  int b;
  int a;
  
  d1._4_4_ = 1;
  d1._0_4_ = 2;
  d2 = 1.0;
  _constB = 2.0;
  constD1._4_4_ = 1;
  constD1._0_4_ = 2;
  constD2 = 1.0;
  test1.constDouble = 2.0;
  Test::Test((Test *)&test2.constDouble,1,1.0,1,1.0);
  Test::Test((Test *)&constTest1.constDouble,2,2.0,2,2.0);
  Test::Test((Test *)&constTest2.constDouble,1,1.0,1,1.0);
  Test::Test((Test *)&swapA,2,2.0,2,2.0);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"swap test:");
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d1._4_4_);
  pOVar1 = system::OutputStream::operator<<(pOVar1," b:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d1._0_4_);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swapB = (char *)((long)&d1 + 4);
  loopTime = (size_t)&d1;
  for (swapA_1 = (char *)0x4; swapA_1 != (char *)0x0; swapA_1 = swapA_1 + -1) {
    *swapB = *swapB ^ *(byte *)loopTime;
    *(byte *)loopTime = *swapB ^ *(byte *)loopTime;
    *swapB = *swapB ^ *(byte *)loopTime;
    swapB = swapB + 1;
    loopTime = loopTime + 1;
  }
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d1._4_4_);
  pOVar1 = system::OutputStream::operator<<(pOVar1," b:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d1._0_4_);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swap<int>((int *)((long)&d1 + 4),(int *)&d1);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d1._4_4_);
  pOVar1 = system::OutputStream::operator<<(pOVar1," b:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d1._0_4_);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d2);
  pOVar1 = system::OutputStream::operator<<(pOVar1," d2:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,_constB);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swapB_1 = (char *)&d2;
  loopTime_1 = (size_t)&constB;
  for (swapA_2 = (char *)0x8; swapA_2 != (char *)0x0; swapA_2 = swapA_2 + -1) {
    *swapB_1 = *swapB_1 ^ *(byte *)loopTime_1;
    *(byte *)loopTime_1 = *swapB_1 ^ *(byte *)loopTime_1;
    *swapB_1 = *swapB_1 ^ *(byte *)loopTime_1;
    swapB_1 = swapB_1 + 1;
    loopTime_1 = loopTime_1 + 1;
  }
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d2);
  pOVar1 = system::OutputStream::operator<<(pOVar1," d2:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,_constB);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swap<double>(&d2,(double *)&constB);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d2);
  pOVar1 = system::OutputStream::operator<<(pOVar1," d2:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,_constB);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,1);
  pOVar1 = system::OutputStream::operator<<(pOVar1," const b:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,2);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swapB_2 = (char *)((long)&constD1 + 4);
  loopTime_2 = (size_t)&constD1;
  for (swapA_3 = (char *)0x4; swapA_3 != (char *)0x0; swapA_3 = swapA_3 + -1) {
    *swapB_2 = *swapB_2 ^ *(byte *)loopTime_2;
    *(byte *)loopTime_2 = *swapB_2 ^ *(byte *)loopTime_2;
    *swapB_2 = *swapB_2 ^ *(byte *)loopTime_2;
    swapB_2 = swapB_2 + 1;
    loopTime_2 = loopTime_2 + 1;
  }
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,1);
  pOVar1 = system::OutputStream::operator<<(pOVar1," const b:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,2);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swap<int>((int *)((long)&constD1 + 4),(int *)&constD1);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,1);
  pOVar1 = system::OutputStream::operator<<(pOVar1," const b:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,2);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"const d1:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,1.0);
  pOVar1 = system::OutputStream::operator<<(pOVar1," const d2:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,2.0);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swapB_3 = (char *)&constD2;
  loopTime_3 = (size_t)&test1.constDouble;
  for (local_138 = 8; local_138 != 0; local_138 = local_138 + -1) {
    *swapB_3 = *swapB_3 ^ *(byte *)loopTime_3;
    *(byte *)loopTime_3 = *swapB_3 ^ *(byte *)loopTime_3;
    *swapB_3 = *swapB_3 ^ *(byte *)loopTime_3;
    swapB_3 = swapB_3 + 1;
    loopTime_3 = loopTime_3 + 1;
  }
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,1.0);
  pOVar1 = system::OutputStream::operator<<(pOVar1," d2:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,2.0);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swap<double>(&constD2,&test1.constDouble);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d2);
  pOVar1 = system::OutputStream::operator<<(pOVar1," d2:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,2.0);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  Test::Test(&local_160,(Test *)&test2.constDouble);
  pOVar1 = operator<<(pOVar1,&local_160);
  pOVar1 = system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<(pOVar1,"test2:");
  Test::Test((Test *)&swapA_4,(Test *)&constTest1.constDouble);
  pOVar1 = operator<<(pOVar1,(Test *)&swapA_4);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swapB_4 = (char *)&test2.constDouble;
  loopTime_4 = (size_t)&constTest1.constDouble;
  for (local_1a0 = 0x28; local_1a0 != 0; local_1a0 = local_1a0 + -1) {
    *swapB_4 = *swapB_4 ^ *(byte *)loopTime_4;
    *(byte *)loopTime_4 = *swapB_4 ^ *(byte *)loopTime_4;
    *swapB_4 = *swapB_4 ^ *(byte *)loopTime_4;
    swapB_4 = swapB_4 + 1;
    loopTime_4 = loopTime_4 + 1;
  }
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  Test::Test(&local_1c8,(Test *)&test2.constDouble);
  pOVar1 = operator<<(pOVar1,&local_1c8);
  pOVar1 = system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<(pOVar1,"test2:");
  Test::Test(&local_1f0,(Test *)&constTest1.constDouble);
  pOVar1 = operator<<(pOVar1,&local_1f0);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swap<cplus::memory::Test>((Test *)&test2.constDouble,(Test *)&constTest1.constDouble);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  Test::Test(&local_218,(Test *)&test2.constDouble);
  pOVar1 = operator<<(pOVar1,&local_218);
  pOVar1 = system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<(pOVar1,"test2:");
  Test::Test(&local_240,(Test *)&constTest1.constDouble);
  pOVar1 = operator<<(pOVar1,&local_240);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  Test::Test(&local_268,(Test *)&constTest2.constDouble);
  pOVar1 = operator<<(pOVar1,&local_268);
  pOVar1 = system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<(pOVar1,"const test2:");
  Test::Test((Test *)&swapA_5,(Test *)&swapA);
  pOVar1 = operator<<(pOVar1,(Test *)&swapA_5);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swapB_5 = (char *)&constTest2.constDouble;
  loopTime_5 = (size_t)&swapA;
  for (local_2a8 = 0x28; local_2a8 != 0; local_2a8 = local_2a8 + -1) {
    *swapB_5 = *swapB_5 ^ *(byte *)loopTime_5;
    *(byte *)loopTime_5 = *swapB_5 ^ *(byte *)loopTime_5;
    *swapB_5 = *swapB_5 ^ *(byte *)loopTime_5;
    swapB_5 = swapB_5 + 1;
    loopTime_5 = loopTime_5 + 1;
  }
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  Test::Test(&local_2d0,(Test *)&constTest2.constDouble);
  pOVar1 = operator<<(pOVar1,&local_2d0);
  pOVar1 = system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<(pOVar1,"const test2:");
  Test::Test(&local_2f8,(Test *)&swapA);
  pOVar1 = operator<<(pOVar1,&local_2f8);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swap<cplus::memory::Test>((Test *)&constTest2.constDouble,(Test *)&swapA);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  Test::Test(&local_320,(Test *)&constTest2.constDouble);
  pOVar1 = operator<<(pOVar1,&local_320);
  pOVar1 = system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<(pOVar1,"const test2:");
  Test::Test((Test *)&swapA_6,(Test *)&swapA);
  pOVar1 = operator<<(pOVar1,(Test *)&swapA_6);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<(pOVar1,"copy test:");
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d1._4_4_);
  pOVar1 = system::OutputStream::operator<<(pOVar1," b:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d1._0_4_);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swapB_6 = (char *)((long)&d1 + 4);
  loopTime_6 = (size_t)&d1;
  for (swapA_7 = (char *)0x4; swapA_7 != (char *)0x0; swapA_7 = swapA_7 + -1) {
    *(char *)loopTime_6 = *swapB_6;
    swapB_6 = swapB_6 + 1;
    loopTime_6 = loopTime_6 + 1;
  }
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d1._4_4_);
  pOVar1 = system::OutputStream::operator<<(pOVar1," b:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d1._0_4_);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  copy<int>((int *)((long)&d1 + 4),(int *)&d1);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d1._4_4_);
  pOVar1 = system::OutputStream::operator<<(pOVar1," b:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d1._0_4_);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d2);
  pOVar1 = system::OutputStream::operator<<(pOVar1," d2:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,_constB);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swapB_7 = (char *)&d2;
  loopTime_7 = (size_t)&constB;
  for (swapA_8 = (char *)0x8; swapA_8 != (char *)0x0; swapA_8 = swapA_8 + -1) {
    *(char *)loopTime_7 = *swapB_7;
    swapB_7 = swapB_7 + 1;
    loopTime_7 = loopTime_7 + 1;
  }
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d2);
  pOVar1 = system::OutputStream::operator<<(pOVar1," d2:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,_constB);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  copy<double>(&d2,(double *)&constB);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d2);
  pOVar1 = system::OutputStream::operator<<(pOVar1," d2:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,_constB);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,1);
  pOVar1 = system::OutputStream::operator<<(pOVar1," const b:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,2);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swapB_8 = (char *)((long)&constD1 + 4);
  loopTime_8 = (size_t)&constD1;
  for (swapA_9 = (char *)0x4; swapA_9 != (char *)0x0; swapA_9 = swapA_9 + -1) {
    *swapB_8 = *swapB_8 ^ *(byte *)loopTime_8;
    *(byte *)loopTime_8 = *swapB_8 ^ *(byte *)loopTime_8;
    *swapB_8 = *swapB_8 ^ *(byte *)loopTime_8;
    swapB_8 = swapB_8 + 1;
    loopTime_8 = loopTime_8 + 1;
  }
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,1);
  pOVar1 = system::OutputStream::operator<<(pOVar1," const b:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,2);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swap<int>((int *)((long)&constD1 + 4),(int *)&constD1);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,1);
  pOVar1 = system::OutputStream::operator<<(pOVar1," const b:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,2);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"const d1:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,1.0);
  pOVar1 = system::OutputStream::operator<<(pOVar1," const d2:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,2.0);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swapB_9 = (char *)&constD2;
  loopTime_9 = (size_t)&test1.constDouble;
  for (local_3a8 = 8; local_3a8 != 0; local_3a8 = local_3a8 + -1) {
    *swapB_9 = *swapB_9 ^ *(byte *)loopTime_9;
    *(byte *)loopTime_9 = *swapB_9 ^ *(byte *)loopTime_9;
    *swapB_9 = *swapB_9 ^ *(byte *)loopTime_9;
    swapB_9 = swapB_9 + 1;
    loopTime_9 = loopTime_9 + 1;
  }
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,1.0);
  pOVar1 = system::OutputStream::operator<<(pOVar1," d2:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,2.0);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swap<double>(&constD2,&test1.constDouble);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,d2);
  pOVar1 = system::OutputStream::operator<<(pOVar1," d2:");
  pOVar1 = system::OutputStream::operator<<(pOVar1,2.0);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  Test::Test(&local_3d0,(Test *)&test2.constDouble);
  pOVar1 = operator<<(pOVar1,&local_3d0);
  pOVar1 = system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<(pOVar1,"test2:");
  Test::Test((Test *)&swapA_10,(Test *)&constTest1.constDouble);
  pOVar1 = operator<<(pOVar1,(Test *)&swapA_10);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swapB_10 = (char *)&test2.constDouble;
  loopTime_10 = (size_t)&constTest1.constDouble;
  for (local_410 = 0x28; local_410 != 0; local_410 = local_410 + -1) {
    *(char *)loopTime_10 = *swapB_10;
    swapB_10 = swapB_10 + 1;
    loopTime_10 = loopTime_10 + 1;
  }
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  Test::Test(&local_438,(Test *)&test2.constDouble);
  pOVar1 = operator<<(pOVar1,&local_438);
  pOVar1 = system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<(pOVar1,"test2:");
  Test::Test(&local_460,(Test *)&constTest1.constDouble);
  pOVar1 = operator<<(pOVar1,&local_460);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  copy<cplus::memory::Test>((Test *)&test2.constDouble,(Test *)&constTest1.constDouble);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  Test::Test(&local_488,(Test *)&test2.constDouble);
  pOVar1 = operator<<(pOVar1,&local_488);
  pOVar1 = system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<(pOVar1,"test2:");
  Test::Test(&local_4b0,(Test *)&constTest1.constDouble);
  pOVar1 = operator<<(pOVar1,&local_4b0);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  Test::Test(&local_4d8,(Test *)&constTest2.constDouble);
  pOVar1 = operator<<(pOVar1,&local_4d8);
  pOVar1 = system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<(pOVar1,"const test2:");
  Test::Test((Test *)&swapA_11,(Test *)&swapA);
  pOVar1 = operator<<(pOVar1,(Test *)&swapA_11);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  swapB_11 = (char *)&constTest2.constDouble;
  loopTime_11 = (size_t)&swapA;
  for (local_518 = 0x28; local_518 != 0; local_518 = local_518 + -1) {
    *(char *)loopTime_11 = *swapB_11;
    swapB_11 = swapB_11 + 1;
    loopTime_11 = loopTime_11 + 1;
  }
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  Test::Test(&local_540,(Test *)&constTest2.constDouble);
  pOVar1 = operator<<(pOVar1,&local_540);
  pOVar1 = system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<(pOVar1,"const test2:");
  Test::Test(&local_568,(Test *)&swapA);
  pOVar1 = operator<<(pOVar1,&local_568);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  copy<cplus::memory::Test>((Test *)&constTest2.constDouble,(Test *)&swapA);
  pOVar1 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  Test::Test(&local_590,(Test *)&constTest2.constDouble);
  pOVar1 = operator<<(pOVar1,&local_590);
  pOVar1 = system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  pOVar1 = system::OutputStream::operator<<(pOVar1,"const test2:");
  Test::Test(&local_5b8,(Test *)&swapA);
  pOVar1 = operator<<(pOVar1,&local_5b8);
  system::OutputStream::operator<<(pOVar1,(Object *)system::endl);
  return;
}

Assistant:

void testMemory_dark_magic() {
			/**
			 * 定义测试用变量
			 */
			int a = 1, b = 2;
			double d1 = 1.0;
			double d2 = 2.0;
			const int constA = 1, constB = 2;
			const double constD1 = 1.0, constD2 = 2.0;
			Test test1(1, 1, 1, 1), test2(2, 2, 2, 2);
			const Test constTest1(1, 1, 1, 1), constTest2(2, 2, 2, 2);
			/**
			 * swap test start
			 */
			//提示开始swap方法测试
			sout << "swap test:" << endl;
			//输出测试前变量的状态
			sout << "a:" << a << " b:" << b << endl;
			//测试非const变量的__SWAP宏
			__SWAP(a, b)
			sout << "a:" << a << " b:" << b << endl;
			//测试非const变量的swap函数
			::cplus::memory::swap(a, b);
			sout << "a:" << a << " b:" << b << endl;
			
			//输出测试前变量的状态
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			//测试非const变量的__SWAP宏
			__SWAP(d1, d2)
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			//测试非const变量的swap函数
			::cplus::memory::swap(d1, d2);
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			
			//输出测试前变量的状态
			sout << "const a:" << constA << " const b:" << constB << endl;
			//测试const变量的__SWAP宏
			__SWAP(constA, constB)
			sout << "const a:" << constA << " const b:" << constB << endl;
			//测试const变量的swap函数
			::cplus::memory::swap(constA, constB);
			sout << "const a:" << constA << " const b:" << constB << endl;
			
			//输出测试前变量的状态
			sout << "const d1:" << constD1 << " const d2:" << constD2 << endl;
			//测试const变量的__SWAP宏
			__SWAP(constD1, constD2)
			sout << "d1:" << constD1 << " d2:" << constD2 << endl;
			//测试const变量的swap函数
			::cplus::memory::swap(constD1, constD2);
			sout << "d1:" << d1 << " d2:" << constD2 << endl;
			
			//输出测试前变量的状态
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			//测试非const变量的__SWAP宏
			__SWAP(test1, test2)
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			//测试非const变量的swap函数
			::cplus::memory::swap(test1, test2);
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			
			//输出测试前变量的状态
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			//测试const变量的__SWAP宏
			__SWAP(constTest1, constTest2)
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			//测试const变量的swap函数
			::cplus::memory::swap(constTest1, constTest2);
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			/**
			 * swap test end
			 */
			
			/**
			 * copy test start
			 */
			//提示开始copy方法测试
			sout << endl << "copy test:" << endl;
			
			//输出测试前变量的状态
			sout << "a:" << a << " b:" << b << endl;
			//测试非const变量的__COPY宏
			__COPY(a, b)
			sout << "a:" << a << " b:" << b << endl;
			//测试非const变量的copy函数
			::cplus::memory::copy(a, b);
			sout << "a:" << a << " b:" << b << endl;
			
			//输出测试前变量的状态
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			//测试非const变量的__COPY宏
			__COPY(d1, d2)
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			//测试非const变量的copy函数
			::cplus::memory::copy(d1, d2);
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			
			
			//输出测试前变量的状态
			sout << "const a:" << constA << " const b:" << constB << endl;
			//测试const变量的__COPY宏
			__SWAP(constA, constB)
			sout << "const a:" << constA << " const b:" << constB << endl;
			//测试const变量的copy函数
			::cplus::memory::swap(constA, constB);
			sout << "const a:" << constA << " const b:" << constB << endl;
			
			//输出测试前变量的状态
			sout << "const d1:" << constD1 << " const d2:" << constD2 << endl;
			//测试const变量的__COPY宏
			__SWAP(constD1, constD2)
			sout << "d1:" << constD1 << " d2:" << constD2 << endl;
			//测试const变量的copy函数
			::cplus::memory::swap(constD1, constD2);
			sout << "d1:" << d1 << " d2:" << constD2 << endl;
			
			//输出测试前变量的状态
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			//测试非const变量的__COPY宏
			__COPY(test1, test2)
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			//测试非const变量的copy函数
			::cplus::memory::copy(test1, test2);
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			
			//输出测试前变量的状态
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			//测试const变量的__COPY宏
			__COPY(constTest1, constTest2)
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			//测试const变量的copy函数
			::cplus::memory::copy(constTest1, constTest2);
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			/**
			 * copy test end
			 */
		}